

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O3

void __thiscall
testing::internal::ParameterizedTestSuiteInfo<P256NistzImplTest>::RegisterTests
          (ParameterizedTestSuiteInfo<P256NistzImplTest> *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  char *__s;
  pointer pcVar3;
  element_type *peVar4;
  _Tuple_impl<0UL,_testing::internal::TestMetaFactoryBase<P256NistzImpl>_*,_std::default_delete<testing::internal::TestMetaFactoryBase<P256NistzImpl>_>_>
  _Var5;
  code *pcVar6;
  char *pcVar7;
  char cVar8;
  bool bVar9;
  int iVar10;
  int iVar11;
  pointer pIVar12;
  long *plVar13;
  long *plVar14;
  P256NistzImpl *value;
  ostream *poVar15;
  size_t sVar16;
  const_iterator cVar17;
  long *plVar18;
  char *pcVar19;
  undefined4 extraout_var;
  SetUpTearDownSuiteFuncType set_up_tc;
  SetUpTearDownSuiteFuncType tear_down_tc;
  TestFactoryBase *factory;
  undefined4 extraout_var_00;
  long lVar20;
  P256NistzImpl *pPVar21;
  TestParamInfo<P256NistzImpl> *pTVar22;
  undefined8 *puVar23;
  byte bVar24;
  string param_name;
  string test_suite_name;
  string test_name;
  ParamGenerator<P256NistzImpl> generator;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  test_param_names;
  pointer local_1d0;
  string local_1c8;
  undefined1 *local_1a8;
  long local_1a0;
  undefined1 local_198;
  undefined7 uStack_197;
  size_t local_188;
  char *local_180;
  undefined8 local_178;
  char local_170;
  undefined7 uStack_16f;
  string local_160;
  long *local_140;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_138;
  CodeLocation local_130;
  pointer local_108;
  pointer local_100;
  pointer local_f8;
  ParameterizedTestSuiteInfo<P256NistzImplTest> *local_f0;
  ParamNameGeneratorFunc *local_e8;
  _func_void_BN_ULONG_ptr_BN_ULONG_ptr_BN_ULONG_ptr **local_e0;
  TestParamInfo<P256NistzImpl> local_d8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  CodeLocation local_58;
  
  bVar24 = 0;
  local_1a8 = &local_198;
  local_1a0 = 0;
  local_198 = 0;
  local_180 = &local_170;
  local_178 = 0;
  local_170 = '\0';
  local_1d0 = (this->tests_).
              super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<P256NistzImplTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<P256NistzImplTest>::TestInfo>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_108 = (this->tests_).
              super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<P256NistzImplTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<P256NistzImplTest>::TestInfo>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (local_1d0 != local_108) {
    bVar9 = false;
    local_f0 = this;
    do {
      pIVar12 = (this->instantiations_).
                super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<P256NistzImplTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<P256NistzImplTest>::InstantiationInfo>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_100 = (this->instantiations_).
                  super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<P256NistzImplTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<P256NistzImplTest>::InstantiationInfo>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      if (pIVar12 != local_100) {
        do {
          (*pIVar12->generator)(&local_140);
          sVar2 = (pIVar12->name)._M_string_length;
          local_e8 = pIVar12->name_func;
          __s = pIVar12->file;
          iVar11 = pIVar12->line;
          local_f8 = pIVar12;
          if (sVar2 == 0) {
            local_1a0 = 0;
            *local_1a8 = 0;
          }
          else {
            local_d8.param.name = (char *)&local_d8.param.mul_mont;
            pcVar3 = (pIVar12->name)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>((string *)&local_d8,pcVar3,pcVar3 + sVar2);
            std::__cxx11::string::append((char *)&local_d8);
            std::__cxx11::string::operator=((string *)&local_1a8,(string *)&local_d8);
            if ((_func_void_BN_ULONG_ptr_BN_ULONG_ptr_BN_ULONG_ptr **)local_d8.param.name !=
                &local_d8.param.mul_mont) {
              operator_delete(local_d8.param.name,(ulong)(local_d8.param.mul_mont + 1));
            }
          }
          std::__cxx11::string::_M_append
                    ((char *)&local_1a8,(ulong)(this->test_suite_name_)._M_dataplus._M_p);
          local_88._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          local_88._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_88._M_impl.super__Rb_tree_header._M_header._M_left =
               &local_88._M_impl.super__Rb_tree_header._M_header;
          local_88._M_impl.super__Rb_tree_header._M_node_count = 0;
          local_88._M_impl.super__Rb_tree_header._M_header._M_right =
               local_88._M_impl.super__Rb_tree_header._M_header._M_left;
          plVar13 = (long *)(**(code **)(*local_140 + 0x10))();
          plVar14 = (long *)(**(code **)(*local_140 + 0x18))();
          if (plVar13 != plVar14) {
            local_188 = 0;
            while( true ) {
              cVar8 = (**(code **)(*plVar13 + 0x30))(plVar13,plVar14);
              if (cVar8 != '\0') break;
              value = (P256NistzImpl *)(**(code **)(*plVar13 + 0x28))(plVar13);
              local_178 = 0;
              *local_180 = '\0';
              pPVar21 = value;
              pTVar22 = &local_d8;
              for (lVar20 = 9; lVar20 != 0; lVar20 = lVar20 + -1) {
                (pTVar22->param).name = pPVar21->name;
                pPVar21 = (P256NistzImpl *)((long)pPVar21 + (ulong)bVar24 * -0x10 + 8);
                pTVar22 = (TestParamInfo<P256NistzImpl> *)
                          ((long)pTVar22 + (ulong)bVar24 * -0x10 + 8);
              }
              local_d8.index = local_188;
              (*local_e8)(&local_1c8,&local_d8);
              bVar9 = IsValidParamName(&local_1c8);
              bVar9 = IsTrue(bVar9);
              if (!bVar9) {
                GTestLog::GTestLog((GTestLog *)&local_d8,GTEST_FATAL,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/include/gtest/internal/gtest-param-util.h"
                                   ,0x247);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"Condition IsValidParamName(param_name) failed. ",
                           0x2f);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"Parameterized test name \'",0x19);
                poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cerr,local_1c8._M_dataplus._M_p,
                                     local_1c8._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar15,
                           "\' is invalid (contains spaces, dashes, or any non-alphanumeric characters other than underscores), in "
                           ,0x66);
                if (__s == (char *)0x0) {
                  std::ios::clear((int)poVar15 + (int)*(undefined8 *)(*(long *)poVar15 + -0x18));
                }
                else {
                  sVar16 = strlen(__s);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar15,__s,sVar16);
                }
                std::__ostream_insert<char,std::char_traits<char>>(poVar15," line ",6);
                poVar15 = (ostream *)std::ostream::operator<<(poVar15,iVar11);
                std::__ostream_insert<char,std::char_traits<char>>(poVar15,"",0);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar15 + -0x18) + (char)poVar15);
                std::ostream::put((char)poVar15);
                std::ostream::flush();
                GTestLog::~GTestLog((GTestLog *)&local_d8);
              }
              cVar17 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::find(&local_88,&local_1c8);
              bVar9 = IsTrue((_Rb_tree_header *)cVar17._M_node ==
                             &local_88._M_impl.super__Rb_tree_header);
              if (!bVar9) {
                GTestLog::GTestLog((GTestLog *)&local_d8,GTEST_FATAL,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/include/gtest/internal/gtest-param-util.h"
                                   ,0x24d);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,
                           "Condition test_param_names.count(param_name) == 0 failed. ",0x3a);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"Duplicate parameterized test name \'",0x23);
                poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cerr,local_1c8._M_dataplus._M_p,
                                     local_1c8._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\', in ",6);
                if (__s == (char *)0x0) {
                  std::ios::clear((int)poVar15 + (int)*(undefined8 *)(*(long *)poVar15 + -0x18));
                }
                else {
                  sVar16 = strlen(__s);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar15,__s,sVar16);
                }
                std::__ostream_insert<char,std::char_traits<char>>(poVar15," line ",6);
                plVar18 = (long *)std::ostream::operator<<(poVar15,iVar11);
                std::ios::widen((char)*(undefined8 *)(*plVar18 + -0x18) + (char)plVar18);
                std::ostream::put((char)plVar18);
                std::ostream::flush();
                GTestLog::~GTestLog((GTestLog *)&local_d8);
              }
              peVar4 = (local_1d0->
                       super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<P256NistzImplTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                       )._M_ptr;
              if ((peVar4->test_base_name)._M_string_length != 0) {
                pcVar19 = (char *)std::__cxx11::string::_M_append
                                            ((char *)&local_180,
                                             (ulong)(peVar4->test_base_name)._M_dataplus._M_p);
                std::__cxx11::string::append(pcVar19);
              }
              std::__cxx11::string::_M_append((char *)&local_180,(ulong)local_1c8._M_dataplus._M_p);
              std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&local_88,&local_1c8);
              local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_160,local_1a8,local_1a8 + local_1a0);
              pcVar19 = local_180;
              PrintToString<P256NistzImpl>((string *)&local_d8,value);
              pcVar7 = local_d8.param.name;
              peVar4 = (local_1d0->
                       super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<P256NistzImplTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                       )._M_ptr;
              local_130.file._M_dataplus._M_p = (pointer)&local_130.file.field_2;
              pcVar3 = (peVar4->code_location).file._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_130,pcVar3,
                         pcVar3 + (peVar4->code_location).file._M_string_length);
              local_e0 = (_func_void_BN_ULONG_ptr_BN_ULONG_ptr_BN_ULONG_ptr **)pcVar7;
              local_130.line = (peVar4->code_location).line;
              iVar10 = (*(this->super_ParameterizedTestSuiteInfoBase).
                         _vptr_ParameterizedTestSuiteInfoBase[3])(this);
              set_up_tc = SuiteApiResolver<P256NistzImplTest>::GetSetUpCaseOrSuite(__s,iVar11);
              tear_down_tc = SuiteApiResolver<P256NistzImplTest>::GetTearDownCaseOrSuite(__s,iVar11)
              ;
              _Var5.
              super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<P256NistzImpl>_*,_false>.
              _M_head_impl = (((local_1d0->
                               super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<P256NistzImplTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                               )._M_ptr)->test_meta_factory)._M_t.
                             super___uniq_ptr_impl<testing::internal::TestMetaFactoryBase<P256NistzImpl>,_std::default_delete<testing::internal::TestMetaFactoryBase<P256NistzImpl>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_testing::internal::TestMetaFactoryBase<P256NistzImpl>_*,_std::default_delete<testing::internal::TestMetaFactoryBase<P256NistzImpl>_>_>
                             .
                             super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<P256NistzImpl>_*,_false>
              ;
              pcVar6 = *(code **)(*(long *)_Var5.
                                           super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<P256NistzImpl>_*,_false>
                                           ._M_head_impl + 0x10);
              puVar23 = (undefined8 *)&stack0xfffffffffffffdc8;
              for (lVar20 = 9; lVar20 != 0; lVar20 = lVar20 + -1) {
                *puVar23 = value->name;
                value = (P256NistzImpl *)((long)value + (ulong)bVar24 * -0x10 + 8);
                puVar23 = puVar23 + (ulong)bVar24 * -2 + 1;
              }
              factory = (TestFactoryBase *)
                        (*pcVar6)(_Var5.
                                  super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<P256NistzImpl>_*,_false>
                                  ._M_head_impl);
              MakeAndRegisterTestInfo
                        (&local_160,pcVar19,(char *)0x0,(char *)local_e0,&local_130,
                         (TypeId)CONCAT44(extraout_var,iVar10),set_up_tc,tear_down_tc,factory);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_130.file._M_dataplus._M_p != &local_130.file.field_2) {
                operator_delete(local_130.file._M_dataplus._M_p,
                                local_130.file.field_2._M_allocated_capacity + 1);
              }
              this = local_f0;
              if ((_func_void_BN_ULONG_ptr_BN_ULONG_ptr_BN_ULONG_ptr **)local_d8.param.name !=
                  &local_d8.param.mul_mont) {
                operator_delete(local_d8.param.name,(ulong)(local_d8.param.mul_mont + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_160._M_dataplus._M_p != &local_160.field_2) {
                operator_delete(local_160._M_dataplus._M_p,
                                local_160.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
                operator_delete(local_1c8._M_dataplus._M_p,
                                local_1c8.field_2._M_allocated_capacity + 1);
              }
              local_188 = local_188 + 1;
              bVar9 = true;
              (**(code **)(*plVar13 + 0x18))(plVar13);
            }
          }
          if (plVar14 != (long *)0x0) {
            (**(code **)(*plVar14 + 8))(plVar14);
          }
          if (plVar13 != (long *)0x0) {
            (**(code **)(*plVar13 + 8))(plVar13);
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~_Rb_tree(&local_88);
          if (local_138 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_138);
          }
          pIVar12 = local_f8 + 1;
        } while (pIVar12 != local_100);
      }
      local_1d0 = local_1d0 + 1;
    } while (local_1d0 != local_108);
    if (bVar9) goto LAB_002eea5a;
  }
  iVar11 = (*(this->super_ParameterizedTestSuiteInfoBase)._vptr_ParameterizedTestSuiteInfoBase[2])
                     (this);
  paVar1 = &local_58.file.field_2;
  pcVar3 = (this->code_location_).file._M_dataplus._M_p;
  local_58.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar3,pcVar3 + (this->code_location_).file._M_string_length);
  local_58.line = (this->code_location_).line;
  InsertSyntheticTestCase
            ((string *)CONCAT44(extraout_var_00,iVar11),&local_58,
             (this->tests_).
             super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<P256NistzImplTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<P256NistzImplTest>::TestInfo>_>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             (this->tests_).
             super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<P256NistzImplTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<P256NistzImplTest>::TestInfo>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_58.file._M_dataplus._M_p,local_58.file.field_2._M_allocated_capacity + 1);
  }
LAB_002eea5a:
  if (local_180 != &local_170) {
    operator_delete(local_180,CONCAT71(uStack_16f,local_170) + 1);
  }
  if (local_1a8 != &local_198) {
    operator_delete(local_1a8,CONCAT71(uStack_197,local_198) + 1);
  }
  return;
}

Assistant:

void RegisterTests() override {
    bool generated_instantiations = false;

    std::string test_suite_name;
    std::string test_name;
    for (const std::shared_ptr<TestInfo>& test_info : tests_) {
      for (const InstantiationInfo& instantiation : instantiations_) {
        const std::string& instantiation_name = instantiation.name;
        ParamGenerator<ParamType> generator((*instantiation.generator)());
        ParamNameGeneratorFunc* name_func = instantiation.name_func;
        const char* file = instantiation.file;
        int line = instantiation.line;

        if (!instantiation_name.empty())
          test_suite_name = instantiation_name + "/";
        else
          test_suite_name.clear();
        test_suite_name += test_suite_name_;

        size_t i = 0;
        std::set<std::string> test_param_names;
        for (const auto& param : generator) {
          generated_instantiations = true;

          test_name.clear();

          std::string param_name =
              name_func(TestParamInfo<ParamType>(param, i));

          GTEST_CHECK_(IsValidParamName(param_name))
              << "Parameterized test name '" << param_name
              << "' is invalid (contains spaces, dashes, or any "
                 "non-alphanumeric characters other than underscores), in "
              << file << " line " << line << "" << std::endl;

          GTEST_CHECK_(test_param_names.count(param_name) == 0)
              << "Duplicate parameterized test name '" << param_name << "', in "
              << file << " line " << line << std::endl;

          if (!test_info->test_base_name.empty()) {
            test_name.append(test_info->test_base_name).append("/");
          }
          test_name += param_name;

          test_param_names.insert(std::move(param_name));

          MakeAndRegisterTestInfo(
              test_suite_name, test_name.c_str(),
              nullptr,  // No type parameter.
              PrintToString(param).c_str(), test_info->code_location,
              GetTestSuiteTypeId(),
              SuiteApiResolver<TestSuite>::GetSetUpCaseOrSuite(file, line),
              SuiteApiResolver<TestSuite>::GetTearDownCaseOrSuite(file, line),
              test_info->test_meta_factory->CreateTestFactory(param));
          ++i;
        }  // for param
      }  // for instantiation
    }  // for test_info

    if (!generated_instantiations) {
      // There are no generaotrs, or they all generate nothing ...
      InsertSyntheticTestCase(GetTestSuiteName(), code_location_,
                              !tests_.empty());
    }
  }